

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_parser.hpp
# Opt level: O0

path_expression_type * __thiscall
jsoncons::jsonpath::detail::
jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::compile(jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          *this,static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *resources,string_view_type *path)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  path_expression_type *in_RDI;
  error_code ec;
  path_expression_type *result;
  error_code *in_stack_00002400;
  string_view_type *in_stack_00002408;
  static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_00002410;
  jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_00002418;
  size_t in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar3;
  error_category *in_stack_ffffffffffffffd0;
  jsonpath_error *pjStack_28;
  
  std::error_code::error_code((error_code *)in_RDI);
  uVar3 = 0;
  compile(in_stack_00002418,in_stack_00002410,in_stack_00002408,in_stack_00002400);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffd0);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x58);
    ec_00._7_1_ = uVar3;
    ec_00._0_7_ = in_stack_ffffffffffffffc8;
    ec_00._M_cat = in_stack_ffffffffffffffd0;
    jsonpath_error::jsonpath_error
              (pjStack_28,ec_00,(size_t)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffb0);
    __cxa_throw(uVar2,&jsonpath_error::typeinfo,jsonpath_error::~jsonpath_error);
  }
  return in_RDI;
}

Assistant:

path_expression_type compile(static_resources<value_type>& resources, const string_view_type& path)
        {
            std::error_code ec;
            auto result = compile(resources, path, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(jsonpath_error(ec, line_, column_));
            }
            return result;
        }